

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

time_t mz_zip_dos_to_time_t(int dos_time,int dos_date)

{
  time_t tVar1;
  undefined1 local_48 [8];
  tm tm;
  int dos_date_local;
  int dos_time_local;
  
  tm.tm_zone._0_4_ = dos_date;
  tm.tm_zone._4_4_ = dos_time;
  memset(local_48,0,0x38);
  tm.tm_wday = -1;
  tm.tm_mday = ((int)(uint)tm.tm_zone >> 9 & 0x7fU) + 0x50;
  tm.tm_hour = ((int)(uint)tm.tm_zone >> 5 & 0xfU) - 1;
  tm.tm_min = (uint)tm.tm_zone & 0x1f;
  tm.tm_sec = (int)tm.tm_zone._4_4_ >> 0xb & 0x1f;
  local_48._4_4_ = (int)tm.tm_zone._4_4_ >> 5 & 0x3f;
  local_48._0_4_ = (tm.tm_zone._4_4_ & 0x1f) << 1;
  tVar1 = mktime((tm *)local_48);
  return tVar1;
}

Assistant:

static MZ_TIME_T mz_zip_dos_to_time_t(int dos_time, int dos_date) {
  struct tm tm;
  memset(&tm, 0, sizeof(tm));
  tm.tm_isdst = -1;
  tm.tm_year = ((dos_date >> 9) & 127) + 1980 - 1900;
  tm.tm_mon = ((dos_date >> 5) & 15) - 1;
  tm.tm_mday = dos_date & 31;
  tm.tm_hour = (dos_time >> 11) & 31;
  tm.tm_min = (dos_time >> 5) & 63;
  tm.tm_sec = (dos_time << 1) & 62;
  return mktime(&tm);
}